

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O0

void predict_or_learn<false,true,false,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  ostream *poVar2;
  float *pfVar3;
  long in_RDX;
  ulong *in_RDI;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  v_array<float> scores_array;
  uint32_t prediction;
  stringstream outputStringStream;
  label_t mc_label_data;
  float in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  size_t in_stack_fffffffffffffd98;
  code *pcVar4;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 uVar5;
  example *in_stack_fffffffffffffda8;
  learner<char,_example> *in_stack_fffffffffffffdb0;
  string local_218 [32];
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  undefined4 local_1dc;
  undefined4 uStack_1d8;
  undefined4 local_1d4;
  uint local_1ac;
  stringstream local_1a8 [16];
  ostream local_198;
  ulong local_20;
  long local_18;
  ulong *local_8;
  
  local_20 = *(ulong *)(in_RDX + 0x6828);
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (((uint)local_20 == 0) || ((*in_RDI < (local_20 & 0xffffffff) && ((uint)local_20 != -1)))) {
    poVar2 = std::operator<<((ostream *)&std::cout,"label ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)local_20);
    poVar2 = std::operator<<(poVar2," is not in {1,");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_8);
    poVar2 = std::operator<<(poVar2,"} This won\'t work right.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1ac = 1;
  local_1dc = 0x7f7fffff;
  uStack_1d8 = 0;
  local_1d4 = 0;
  *(undefined4 *)(local_18 + 0x6830) = 0;
  *(undefined8 *)(local_18 + 0x6828) = 0x7f7fffff;
  LEARNER::learner<char,_example>::multipredict
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),in_stack_fffffffffffffd98
             ,(polyprediction *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             SUB41((uint)in_stack_fffffffffffffd8c >> 0x18,0));
  for (local_1f0 = 2; (ulong)local_1f0 <= *local_8; local_1f0 = local_1f0 + 1) {
    fVar1 = *(float *)(local_8[2] + (ulong)(local_1f0 - 1) * 0x20);
    pfVar3 = (float *)(local_8[2] + (ulong)(local_1ac - 1) * 0x20);
    if (*pfVar3 <= fVar1 && fVar1 != *pfVar3) {
      local_1ac = local_1f0;
    }
  }
  if (*(long *)(local_18 + 0x68c0) != 0) {
    for (local_1f4 = 1; (ulong)local_1f4 <= *local_8; local_1f4 = local_1f4 + 1) {
      add_passthrough_feature_magic
                ((example *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd7c);
    }
  }
  poVar2 = std::operator<<(&local_198,"1:");
  std::ostream::operator<<(poVar2,*(float *)local_8[2]);
  for (local_1f8 = 2; (ulong)local_1f8 <= *local_8; local_1f8 = local_1f8 + 1) {
    poVar2 = std::operator<<(&local_198,' ');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1f8);
    poVar2 = std::operator<<(poVar2,':');
    std::ostream::operator<<(poVar2,*(float *)(local_8[2] + (ulong)(local_1f8 - 1) * 0x20));
  }
  pcVar4 = *(code **)(local_8[1] + 0x3540);
  uVar5 = *(undefined4 *)(local_8[1] + 0x3530);
  std::__cxx11::stringstream::str();
  (*pcVar4)(uVar5,local_218);
  std::__cxx11::string::~string(local_218);
  *(uint *)(local_18 + 0x6850) = local_1ac;
  *(ulong *)(local_18 + 0x6828) = local_20;
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}